

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void destroy_window_data(SWindowData *window_data)

{
  long *in_RDI;
  SWindowData_X11 *window_data_x11;
  SWindowData *window_data_00;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      window_data_00 = (SWindowData *)*in_RDI;
      destroy_GL_context(window_data_00);
      mfb_timer_destroy((mfb_timer *)0x1040f1);
      memset(window_data_00,0,0x38);
      free(window_data_00);
    }
    memset(in_RDI,0,0x2b0);
    free(in_RDI);
  }
  return;
}

Assistant:

void
destroy_window_data(SWindowData *window_data)  {
    if (window_data != 0x0) {
        if (window_data->specific != 0x0) {
            SWindowData_X11   *window_data_x11 = (SWindowData_X11 *) window_data->specific;

#if defined(USE_OPENGL_API)
            destroy_GL_context(window_data);
#else
            if (window_data_x11->image != 0x0) {
                window_data_x11->image->data = 0x0;
                XDestroyImage(window_data_x11->image);
                XDestroyWindow(window_data_x11->display, window_data_x11->window);
                XCloseDisplay(window_data_x11->display);
            }
#endif

            mfb_timer_destroy(window_data_x11->timer);
            memset(window_data_x11, 0, sizeof(SWindowData_X11));
            free(window_data_x11);
        }
        memset(window_data, 0, sizeof(SWindowData));
        free(window_data);
    }
}